

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O1

Clause * __thiscall Shell::EqualityProxyMono::apply(EqualityProxyMono *this,Clause *cl)

{
  Literal ***pppLVar1;
  Literal *lit;
  Unit *pUVar2;
  uint uVar3;
  Clause *pCVar4;
  Self SVar5;
  uint uVar6;
  Literal **ppLVar7;
  Literal *pLVar8;
  Entry *pEVar9;
  Entry *pEVar10;
  Literal **ppLVar11;
  undefined8 *puVar12;
  ulong uVar13;
  undefined8 *puVar14;
  Unit **ppUVar15;
  bool bVar16;
  Literal **ppLVar17;
  RStack<Literal_*> resLits;
  Stack<Kernel::Unit_*> local_e8;
  Clause *local_c8;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_c0;
  EqualityProxyMono *local_b0;
  NonspecificInference2 local_a8;
  Inference local_90;
  Inference local_60;
  
  local_e8._cursor = (Unit **)0x0;
  local_e8._end = (Unit **)0x0;
  local_e8._capacity = 0;
  local_e8._stack = (Unit **)0x0;
  local_b0 = this;
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_c0);
  uVar6 = *(uint *)&cl->field_0x38 & 0xfffff;
  if (uVar6 != 0) {
    uVar13 = (ulong)(uVar6 != 0);
    bVar16 = false;
    ppLVar7 = cl->_literals;
    ppLVar11 = cl->_literals + uVar13;
    local_c8 = cl;
    do {
      lit = *ppLVar7;
      pLVar8 = apply(local_b0,lit);
      SVar5._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )local_c0._self;
      if (*(Literal ***)
           ((long)local_c0._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10
           ) == *(Literal ***)
                 ((long)local_c0._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x18)) {
        ::Lib::Stack<Kernel::Literal_*>::expand
                  ((Stack<Kernel::Literal_*> *)
                   local_c0._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
      }
      **(Literal ***)
        ((long)SVar5._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
           pLVar8;
      pppLVar1 = (Literal ***)
                 ((long)SVar5._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      *pppLVar1 = *pppLVar1 + 1;
      if (pLVar8 != lit) {
        local_a8._0_4_ = (pLVar8->super_Term)._functor;
        pEVar9 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                 findEntry(&s_proxyPredicateSorts,(uint *)&local_a8);
        local_a8._0_8_ = (pEVar9->_val)._content;
        pEVar10 = ::Lib::
                  DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  findEntry(&s_proxyPremises,(TermList *)&local_a8);
        pUVar2 = pEVar10->_val;
        if (local_e8._cursor == local_e8._end) {
          ::Lib::Stack<Kernel::Unit_*>::expand(&local_e8);
        }
        *local_e8._cursor = pUVar2;
        local_e8._cursor = local_e8._cursor + 1;
        bVar16 = true;
      }
      pCVar4 = local_c8;
      uVar3 = (uint)uVar13;
      ppLVar17 = ppLVar11 + 1;
      if (uVar6 <= uVar3) {
        ppLVar11 = (Literal **)0x0;
      }
      uVar13 = (ulong)(uVar3 + 1);
      ppLVar7 = ppLVar11;
      ppLVar11 = ppLVar17;
    } while (uVar3 < uVar6);
    cl = local_c8;
    if (bVar16) {
      if ((long)local_e8._cursor - (long)local_e8._stack == 8) {
        local_a8.premise2 = local_e8._cursor[-1];
        local_a8.rule = 0x6d;
        local_a8.premise1 = &local_c8->super_Unit;
        Kernel::Inference::Inference(&local_60,&local_a8);
        cl = Kernel::Clause::fromStack
                       ((Stack<Kernel::Literal_*> *)
                        local_c0._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                        &local_60);
      }
      else {
        if (local_e8._stack == local_e8._cursor) {
          puVar12 = (undefined8 *)0x0;
        }
        else {
          puVar14 = (undefined8 *)0x0;
          ppUVar15 = local_e8._cursor;
          do {
            pUVar2 = ppUVar15[-1];
            puVar12 = (undefined8 *)
                      ::Lib::FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)
                                 (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
            ppUVar15 = ppUVar15 + -1;
            *puVar12 = pUVar2;
            puVar12[1] = puVar14;
            puVar14 = puVar12;
          } while (ppUVar15 != local_e8._stack);
        }
        local_a8.premise1 =
             (Unit *)::Lib::FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)
                                (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
        *(Clause **)&((Clause *)local_a8.premise1)->super_Unit = pCVar4;
        *(undefined8 **)&(((Clause *)local_a8.premise1)->super_Unit)._inference = puVar12;
        local_a8.rule = 0x6d;
        Kernel::Inference::Inference(&local_90,(NonspecificInferenceMany *)&local_a8);
        cl = Kernel::Clause::fromStack
                       ((Stack<Kernel::Literal_*> *)
                        local_c0._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                        &local_90);
      }
      (cl->super_Unit)._inference._age = (pCVar4->super_Unit)._inference._age;
    }
  }
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_c0);
  if (local_e8._stack != (Unit **)0x0) {
    uVar13 = local_e8._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar13 == 0) {
      *local_e8._stack = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_e8._stack;
    }
    else if (uVar13 < 0x11) {
      *local_e8._stack = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_e8._stack;
    }
    else if (uVar13 < 0x19) {
      *local_e8._stack = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_e8._stack;
    }
    else if (uVar13 < 0x21) {
      *local_e8._stack = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_e8._stack;
    }
    else if (uVar13 < 0x31) {
      *local_e8._stack = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_e8._stack;
    }
    else if (uVar13 < 0x41) {
      *local_e8._stack = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_e8._stack;
    }
    else {
      operator_delete(local_e8._stack,0x10);
    }
  }
  return cl;
}

Assistant:

Clause* EqualityProxyMono::apply(Clause* cl)
{
  UnitStack proxyPremises;
  RStack<Literal*> resLits;

  bool modified = false;
  for (Literal* lit : cl->iterLits()) {
    Literal* rlit=apply(lit);
    resLits->push(rlit);
    if (rlit != lit) {
      ASS(lit->isEquality());
      modified = true;
      TermList srt = s_proxyPredicateSorts.get(rlit->functor());
      Unit* prem = s_proxyPremises.get(srt);
      proxyPremises.push(prem);
    }
  }
  if (!modified) {
    return cl;
  }

  Clause* res;
  ASS(proxyPremises.isNonEmpty());
  if (proxyPremises.size() == 1) {
    res = Clause::fromStack(*resLits,
        NonspecificInference2(InferenceRule::EQUALITY_PROXY_REPLACEMENT, cl, proxyPremises.top()));
  }
  else {
    UnitList* prems = 0;
    UnitList::pushFromIterator(UnitStack::ConstIterator(proxyPremises),prems);
    UnitList::push(cl,prems);

    res = Clause::fromStack(*resLits,
        NonspecificInferenceMany(InferenceRule::EQUALITY_PROXY_REPLACEMENT, prems));
  }
  // TODO isn't this done atomatically
  res->setAge(cl->age()); // MS: this seems useless; as long as EqualityProxy is only operating as a part of preprocessing, age is going to 0 anyway

  return res;
}